

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalTree.h
# Opt level: O1

IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> * __thiscall
IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::operator=
          (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *this,intervalTree *other)

{
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *pIVar1;
  __uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  _Var2;
  unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  uVar3;
  __uniq_ptr_data<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>,_true,_true>
  in_RAX;
  _Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false> local_18;
  
  this->center = other->center;
  local_18._M_head_impl =
       (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)
       in_RAX.
       super___uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
       .super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>.
       _M_head_impl;
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::operator=(&this->intervals,&other->intervals);
  if ((other->left)._M_t.
      super___uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      .super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>.
      _M_head_impl == (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)0x0) {
    local_18._M_head_impl = (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)0x0;
  }
  else {
    copyTree((IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)&stack0xffffffffffffffe8,
             this);
  }
  _Var2._M_t.
  super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  .super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>.
  _M_head_impl = (tuple<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                  )(tuple<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                    )local_18._M_head_impl;
  local_18._M_head_impl = (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)0x0;
  pIVar1 = (this->left)._M_t.
           super___uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           .
           super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>
           ._M_head_impl;
  (this->left)._M_t.
  super___uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  .super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>.
  _M_head_impl = (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)
                 _Var2._M_t.
                 super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                 .
                 super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>
                 ._M_head_impl;
  if (pIVar1 != (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)0x0) {
    std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>::operator()
              ((default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_> *)
               &this->left,pIVar1);
  }
  std::
  unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                 *)&stack0xffffffffffffffe8);
  if ((other->right)._M_t.
      super___uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      .super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>.
      _M_head_impl == (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)0x0) {
    local_18._M_head_impl = (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)0x0;
  }
  else {
    copyTree((IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)&stack0xffffffffffffffe8,
             this);
  }
  uVar3._M_t.
  super___uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  .super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>,_true,_true>
                  )(__uniq_ptr_data<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>,_true,_true>
                    )local_18._M_head_impl;
  local_18._M_head_impl = (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)0x0;
  pIVar1 = (this->right)._M_t.
           super___uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           .
           super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>
           ._M_head_impl;
  (this->right)._M_t.
  super___uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  .super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>.
  _M_head_impl = (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)
                 uVar3._M_t.
                 super___uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                 .
                 super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>
                 ._M_head_impl;
  if (pIVar1 != (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)0x0) {
    std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>::operator()
              ((default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_> *)
               &this->right,pIVar1);
  }
  std::
  unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                 *)&stack0xffffffffffffffe8);
  return this;
}

Assistant:

IntervalTree<T,K>& operator=(const intervalTree& other) {
        center = other.center;
        intervals = other.intervals;
        left = other.left ? copyTree(*other.left) : nullptr;
        right = other.right ? copyTree(*other.right) : nullptr;
        return *this;
    }